

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

string * __thiscall
duckdb::DBConfig::SanitizeAllowedPath(string *__return_storage_ptr__,DBConfig *this,string *path)

{
  bool bVar1;
  pointer pFVar2;
  string path_sep;
  allocator local_79;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     (&this->file_system);
  (*pFVar2->_vptr_FileSystem[0x19])(&local_38,pFVar2,path);
  bVar1 = ::std::operator!=(&local_38,"/");
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&local_58,(string *)path);
    ::std::__cxx11::string::string((string *)&local_78,"/",&local_79);
    StringUtil::Replace(__return_storage_ptr__,&local_58,&local_38,&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  }
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string DBConfig::SanitizeAllowedPath(const string &path) const {
	auto path_sep = file_system->PathSeparator(path);
	if (path_sep != "/") {
		// allowed_directories/allowed_path always uses forward slashes regardless of the OS
		return StringUtil::Replace(path, path_sep, "/");
	}
	return path;
}